

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O0

NormalizationResult *
Kernel::normalizeAdd<Kernel::NumTraits<Kernel::RealConstantType>>
          (NormalizationResult *lhs,NormalizationResult *rhs)

{
  bool bVar1;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *pPVar2;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *this;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *pSVar3;
  Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *this_00;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_RDI;
  RefIterator it;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *r_3;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *l_3;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> summands;
  PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_> *r_2;
  PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_> *l_2;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *l_1;
  PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_> *r_1;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *r;
  PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_> *l;
  Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *in_stack_fffffffffffffe18;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_stack_fffffffffffffe20;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffe28;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_stack_fffffffffffffe40;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffe78;
  Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *in_stack_fffffffffffffe80;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_stack_fffffffffffffeb8;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffec0;
  PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff50;
  RenderMonom *in_stack_ffffffffffffff58;
  
  bVar1 = Lib::
          Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
          ::is<Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                    ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      *)0x928379);
  if ((bVar1) &&
     (bVar1 = Lib::
              Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
              ::is<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>>
                        ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          *)0x92838f), bVar1)) {
    Lib::
    Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
    ::unwrap<Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
              ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                *)0x9283a5);
    pPVar2 = Lib::
             Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
             ::unwrap<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>>
                       ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                         *)0x9283ba);
    Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::raw(pPVar2);
    RenderMonom::operator()(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x928414);
    Lib::
    Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ::Coproduct((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                 *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  else {
    bVar1 = Lib::
            Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
            ::is<Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                      ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                        *)0x92845e);
    if ((bVar1) &&
       (bVar1 = Lib::
                Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                ::is<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>>
                          ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                            *)0x928474), bVar1)) {
      Lib::
      Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
      ::unwrap<Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                  *)0x92848a);
      pPVar2 = Lib::
               Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
               ::unwrap<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>>
                         ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                           *)0x92849f);
      Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::raw(pPVar2);
      RenderMonom::operator()(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
                ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x9284f9);
      Lib::
      Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ::Coproduct((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                   *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    }
    else {
      bVar1 = Lib::
              Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
              ::is<Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                        ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          *)0x928543);
      if ((bVar1) &&
         (bVar1 = Lib::
                  Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                  ::is<Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                            ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                              *)0x928559), bVar1)) {
        Lib::
        Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
        ::unwrap<Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                  ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    *)0x92856f);
        Lib::
        Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
        ::unwrap<Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                  ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    *)0x928584);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
                  (in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
        RenderMonom::operator()(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
                  ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x9285e1);
        RenderMonom::operator()(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
                  ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x928624);
        Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        Lib::
        Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ::Coproduct<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_0>
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
                  ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x928653);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack
                  (in_stack_fffffffffffffe20);
      }
      else {
        pPVar2 = Lib::
                 Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                 ::unwrap<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>>
                           ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                             *)0x9286fe);
        this = Lib::
               Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
               ::unwrap<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>>
                         ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                           *)0x928710);
        Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::raw(pPVar2);
        pSVar3 = Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::raw(pPVar2);
        this_00 = (Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                   *)Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::size
                               (pSVar3);
        pSVar3 = Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::raw(this);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::size(pSVar3);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::reserve
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::raw(pPVar2);
        Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::raw(this);
        it = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::iter
                       ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                        0x928780);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>::
        loadFromIterator<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>::RefIterator>
                  (in_RDI,it);
        Lib::
        Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ::Coproduct(this_00,in_stack_fffffffffffffe18);
      }
    }
  }
  return (NormalizationResult *)in_RDI;
}

Assistant:

NormalizationResult normalizeAdd(NormalizationResult& lhs, NormalizationResult& rhs) {
  using Polynom = Polynom<NumTraits>;
  using Monom = Monom<NumTraits>;
  using PreMonom = PreMonom<NumTraits>;
  ASS(lhs.is<Polynom>() || lhs.is<PreMonom>())
  ASS(rhs.is<Polynom>() || rhs.is<PreMonom>())

  if (lhs.is<PreMonom>() && rhs.is<Polynom>())  {
    auto& l = lhs.unwrap<PreMonom>();
    auto& r = rhs.unwrap<Polynom>();
    /* Monom(...) + Polynom(x0, x1, ...) ==> Polynom(x0, x1, ..., Monom(...)) */
    r.raw().push(RenderMonom{}(std::move(l)));
    return std::move(rhs);

  } else if (rhs.is<PreMonom>() && lhs.is<Polynom>()){
    auto& r = rhs.unwrap<PreMonom>();
    auto& l = lhs.unwrap<Polynom>();

    /*  Polynom(x0, x1, ...) + Monom(...) ==> Polynom(x0, x1, ..., Monom(...)) */
    l.raw().push(RenderMonom{}(std::move(r)));
    return std::move(lhs);

  } else if (lhs.is<PreMonom>() && rhs.is<PreMonom>()) {
    auto& l = lhs.unwrap<PreMonom>();
    auto& r = rhs.unwrap<PreMonom>();

    /* Monom(x0, x1, ...) + Monom(y0, y1, ...) ==> Polynom(Monom(x0, x1, ...), Polynom(y0, y1, ...)) */
    Stack<Monom> summands(2);
    summands.push(RenderMonom{}(std::move(l)));
    summands.push(RenderMonom{}(std::move(r)));
    return NormalizationResult(Polynom(std::move(summands)));

  } else{
    ASS(lhs.is<Polynom>())
    ASS(rhs.is<Polynom>())
    auto& l = lhs.unwrap<Polynom>();
    auto& r = rhs.unwrap<Polynom>();

    /* Polynom(x0, x1, ...) + Polynom(y0, y1, ...) ==> Polynom(x0, x1, ..., y0, y1, ...) */
    l.raw().reserve(l.raw().size() + r.raw().size());
    l.raw().loadFromIterator(r.raw().iter());
    return std::move(lhs);
  }
}